

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::exprP<float>(BuiltinPrecisionTests *this,Expr<float> *ptr)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_28;
  Expr<float> *local_18;
  Expr<float> *ptr_local;
  
  local_18 = ptr;
  ptr_local = (Expr<float> *)this;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::SharedPtr(&local_28,ptr);
  exprP<float>(this,&local_28);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::~SharedPtr(&local_28);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<T> exprP (const Expr<T>* ptr)
{
	return exprP(SharedPtr<const Expr<T> >(ptr));
}